

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::StrengthReductionPass::ReplaceMultiplyByPowerOf2
          (StrengthReductionPass *this,iterator *inst)

{
  IRContext *pIVar1;
  undefined1 uVar2;
  uint32_t uVar3;
  array<signed_char,_4UL> aVar4;
  Instruction *pIVar5;
  Operand *__x;
  Instruction *this_00;
  uint uVar6;
  uint32_t uVar7;
  bool bVar8;
  uint uVar9;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> newOperands;
  undefined1 local_a8 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_78;
  iterator local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  pIVar5 = (inst->super_iterator).node_;
  if (pIVar5->opcode_ != OpIMul) {
    __assert_fail("(*inst)->opcode() == spv::Op::OpIMul && \"Only works for multiplication of integers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/strength_reduction_pass.cpp"
                  ,0x45,
                  "bool spvtools::opt::StrengthReductionPass::ReplaceMultiplyByPowerOf2(BasicBlock::iterator *)"
                 );
  }
  uVar3 = 0;
  if (pIVar5->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
  }
  if (uVar3 != *(uint32_t *)&(this->super_Pass).field_0x34) {
    pIVar5 = (inst->super_iterator).node_;
    uVar3 = 0;
    if (pIVar5->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
    }
    if (uVar3 != this->uint32_type_id_) {
      return false;
    }
  }
  uVar9 = 0;
  bVar8 = true;
  while( true ) {
    pIVar5 = (inst->super_iterator).node_;
    uVar6 = (pIVar5->has_result_id_ & 1) + 1;
    if (pIVar5->has_type_id_ == false) {
      uVar6 = (uint)pIVar5->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(pIVar5,uVar6 + uVar9);
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    pIVar5 = analysis::DefUseManager::GetDef
                       ((pIVar1->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,uVar3);
    if ((pIVar5->opcode_ == OpConstant) &&
       (uVar3 = Instruction::GetSingleWordOperand(pIVar5,2), uVar3 - 1 < (uVar3 ^ uVar3 - 1)))
    break;
    uVar9 = 1;
    uVar2 = !bVar8;
    bVar8 = false;
    if ((bool)uVar2) {
      return false;
    }
  }
  uVar7 = 0;
  if ((uVar3 & 1) == 0) {
    uVar7 = 0;
    do {
      uVar7 = uVar7 + 1;
      uVar6 = uVar3 & 2;
      uVar3 = uVar3 >> 1;
    } while (uVar6 == 0);
  }
  aVar4._M_elems = (_Type)GetConstantId(this,uVar7);
  uVar3 = Pass::TakeNextId(&this->super_Pass);
  uVar7 = 0;
  local_78.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = Instruction::GetInOperand((inst->super_iterator).node_,uVar9 ^ 1);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            (&local_78,__x);
  local_58._0_8_ = &PTR__SmallVector_00b02ef8;
  local_58._24_8_ = local_58 + 0x10;
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._8_8_ = 1;
  local_a8._0_4_ = SPV_OPERAND_TYPE_ID;
  local_a8._8_8_ = &PTR__SmallVector_00b02ef8;
  local_a8._16_8_ = 0;
  local_a8._32_8_ = local_a8 + 0x18;
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._16_4_ = aVar4._M_elems;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_58);
  local_58._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_38,local_38._M_head_impl);
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            (&local_78,(value_type *)local_a8);
  this_00 = (Instruction *)operator_new(0x70);
  pIVar1 = (this->super_Pass).context_;
  pIVar5 = (inst->super_iterator).node_;
  if (pIVar5->has_type_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar5,0);
  }
  Instruction::Instruction(this_00,pIVar1,OpShiftLeftLogical,uVar7,uVar3,&local_78);
  local_58._0_8_ = this_00;
  InstructionList::iterator::InsertBefore
            ((iterator *)&local_60,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)inst);
  (inst->super_iterator).node_ = local_60.node_;
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
    local_60.node_ = (inst->super_iterator).node_;
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             local_60.node_);
  pIVar5 = (((inst->super_iterator).node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
           next_node_;
  (inst->super_iterator).node_ = pIVar5;
  pIVar1 = (this->super_Pass).context_;
  uVar7 = 0;
  if (pIVar5->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
  }
  IRContext::ReplaceAllUsesWith(pIVar1,uVar7,uVar3);
  pIVar5 = (inst->super_iterator).node_;
  (inst->super_iterator).node_ =
       (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
  IRContext::KillInst((this->super_Pass).context_,pIVar5);
  if ((Instruction *)local_58._0_8_ != (Instruction *)0x0) {
    (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_58._0_8_)->_vptr_IntrusiveNodeBase[1])
              ();
  }
  local_a8._8_8_ = &PTR__SmallVector_00b02ef8;
  if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,local_80._M_head_impl);
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_78);
  return true;
}

Assistant:

bool StrengthReductionPass::ReplaceMultiplyByPowerOf2(
    BasicBlock::iterator* inst) {
  assert((*inst)->opcode() == spv::Op::OpIMul &&
         "Only works for multiplication of integers.");
  bool modified = false;

  // Currently only works on 32-bit integers.
  if ((*inst)->type_id() != int32_type_id_ &&
      (*inst)->type_id() != uint32_type_id_) {
    return modified;
  }

  // Check the operands for a constant that is a power of 2.
  for (int i = 0; i < 2; i++) {
    uint32_t opId = (*inst)->GetSingleWordInOperand(i);
    Instruction* opInst = get_def_use_mgr()->GetDef(opId);
    if (opInst->opcode() == spv::Op::OpConstant) {
      // We found a constant operand.
      uint32_t constVal = opInst->GetSingleWordOperand(2);

      if (IsPowerOf2(constVal)) {
        modified = true;
        uint32_t shiftAmount = CountTrailingZeros(constVal);
        uint32_t shiftConstResultId = GetConstantId(shiftAmount);

        // Create the new instruction.
        uint32_t newResultId = TakeNextId();
        std::vector<Operand> newOperands;
        newOperands.push_back((*inst)->GetInOperand(1 - i));
        Operand shiftOperand(spv_operand_type_t::SPV_OPERAND_TYPE_ID,
                             {shiftConstResultId});
        newOperands.push_back(shiftOperand);
        std::unique_ptr<Instruction> newInstruction(
            new Instruction(context(), spv::Op::OpShiftLeftLogical,
                            (*inst)->type_id(), newResultId, newOperands));

        // Insert the new instruction and update the data structures.
        (*inst) = (*inst).InsertBefore(std::move(newInstruction));
        get_def_use_mgr()->AnalyzeInstDefUse(&*(*inst));
        ++(*inst);
        context()->ReplaceAllUsesWith((*inst)->result_id(), newResultId);

        // Remove the old instruction.
        Instruction* inst_to_delete = &*(*inst);
        --(*inst);
        context()->KillInst(inst_to_delete);

        // We do not want to replace the instruction twice if both operands
        // are constants that are a power of 2.  So we break here.
        break;
      }
    }
  }

  return modified;
}